

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  void *__ptr;
  long *plVar3;
  int iVar4;
  Layer *pLVar5;
  long lVar6;
  ParamDict pd;
  ModelBinFromMatArray local_168;
  Mat local_158;
  void *local_110;
  int *piStack_108;
  size_t local_100;
  int local_f8;
  Allocator *local_f0;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  size_t local_d0;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int local_90;
  size_t local_88;
  void *local_80;
  int *piStack_78;
  size_t local_70;
  int local_68;
  Allocator *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  size_t local_40;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar4 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar4;
  }
  if ((this->kernel_h == 1 && (this->kernel_w == 1 && bottom_blob->dims == 1)) &&
     (bottom_blob->elempack * bottom_blob->w == this->weight_data_size / this->num_output)) {
    pLVar5 = create_layer(0xf);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->num_output);
    ParamDict::set(&pd,1,this->bias_term);
    ParamDict::set(&pd,2,this->weight_data_size);
    ParamDict::set(&pd,8,this->int8_scale_term);
    ParamDict::set(&pd,9,this->activation_type);
    ParamDict::set(&pd,10,&this->activation_params);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    lVar6 = 0x40;
    do {
      *(undefined8 *)((long)&local_158.data + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe68 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe70 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe74 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe7c + lVar6) = 0;
      *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6) = 0;
      *(undefined8 *)((long)&pd.d + lVar6) = 0;
      *(undefined8 *)((long)&pd.d + lVar6 + 4) = 0;
      *(undefined8 *)((long)&local_168.super_ModelBin._vptr_ModelBin + lVar6 + 4) = 0;
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0x160);
    if (&local_158 != &this->weight_data) {
      piVar1 = (this->weight_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_158.data = (this->weight_data).data;
      piVar1 = (this->weight_data).refcount;
      local_158.refcount._0_4_ = SUB84(piVar1,0);
      local_158.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
      sVar2 = (this->weight_data).elemsize;
      local_158.elemsize._0_4_ = (undefined4)sVar2;
      local_158.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      local_158.elempack = (this->weight_data).elempack;
      local_158.allocator = (this->weight_data).allocator;
      local_158.dims = (this->weight_data).dims;
      local_158.w = (this->weight_data).w;
      local_158.h = (this->weight_data).h;
      local_158.d = (this->weight_data).d;
      local_158.c = (this->weight_data).c;
      local_158.cstep = (this->weight_data).cstep;
    }
    if ((Mat *)&local_110 != &this->bias_data) {
      piVar1 = (this->bias_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      if (piStack_108 != (int *)0x0) {
        LOCK();
        *piStack_108 = *piStack_108 + -1;
        UNLOCK();
        if (*piStack_108 == 0) {
          if (local_f0 == (Allocator *)0x0) {
            if (local_110 != (void *)0x0) {
              free(local_110);
            }
          }
          else {
            (*local_f0->_vptr_Allocator[3])();
          }
        }
      }
      local_110 = (this->bias_data).data;
      piStack_108 = (this->bias_data).refcount;
      local_100 = (this->bias_data).elemsize;
      local_f8 = (this->bias_data).elempack;
      local_f0 = (this->bias_data).allocator;
      local_e8 = (this->bias_data).dims;
      iStack_e4 = (this->bias_data).w;
      iStack_e0 = (this->bias_data).h;
      iStack_dc = (this->bias_data).d;
      local_d8 = (this->bias_data).c;
      local_d0 = (this->bias_data).cstep;
    }
    if (this->int8_scale_term != 0) {
      if ((Mat *)&local_c8 != &this->weight_data_int8_scales) {
        piVar1 = (this->weight_data_int8_scales).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        if (piStack_c0 != (int *)0x0) {
          LOCK();
          *piStack_c0 = *piStack_c0 + -1;
          UNLOCK();
          if (*piStack_c0 == 0) {
            if (local_a8 == (Allocator *)0x0) {
              if (local_c8 != (void *)0x0) {
                free(local_c8);
              }
            }
            else {
              (*local_a8->_vptr_Allocator[3])();
            }
          }
        }
        local_c8 = (this->weight_data_int8_scales).data;
        piStack_c0 = (this->weight_data_int8_scales).refcount;
        local_b8 = (this->weight_data_int8_scales).elemsize;
        local_b0 = (this->weight_data_int8_scales).elempack;
        local_a8 = (this->weight_data_int8_scales).allocator;
        local_a0 = (this->weight_data_int8_scales).dims;
        iStack_9c = (this->weight_data_int8_scales).w;
        iStack_98 = (this->weight_data_int8_scales).h;
        iStack_94 = (this->weight_data_int8_scales).d;
        local_90 = (this->weight_data_int8_scales).c;
        local_88 = (this->weight_data_int8_scales).cstep;
      }
      if ((Mat *)&local_80 != &this->bottom_blob_int8_scales) {
        piVar1 = (this->bottom_blob_int8_scales).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        if (piStack_78 != (int *)0x0) {
          LOCK();
          *piStack_78 = *piStack_78 + -1;
          UNLOCK();
          if (*piStack_78 == 0) {
            if (local_60 == (Allocator *)0x0) {
              if (local_80 != (void *)0x0) {
                free(local_80);
              }
            }
            else {
              (*local_60->_vptr_Allocator[3])();
            }
          }
        }
        local_80 = (this->bottom_blob_int8_scales).data;
        piStack_78 = (this->bottom_blob_int8_scales).refcount;
        local_70 = (this->bottom_blob_int8_scales).elemsize;
        local_68 = (this->bottom_blob_int8_scales).elempack;
        local_60 = (this->bottom_blob_int8_scales).allocator;
        local_58._0_4_ = (this->bottom_blob_int8_scales).dims;
        local_58._4_4_ = (this->bottom_blob_int8_scales).w;
        uStack_50._0_4_ = (this->bottom_blob_int8_scales).h;
        uStack_50._4_4_ = (this->bottom_blob_int8_scales).d;
        local_48 = (this->bottom_blob_int8_scales).c;
        local_40 = (this->bottom_blob_int8_scales).cstep;
      }
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_168,&local_158);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_168);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_168);
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
    (*pLVar5->_vptr_Layer[7])(pLVar5,bottom_blob,top_blob,opt);
    (*pLVar5->_vptr_Layer[5])(pLVar5,opt);
    (*pLVar5->_vptr_Layer[1])(pLVar5);
    lVar6 = 0xd8;
    do {
      piVar1 = *(int **)((long)&local_158.refcount + lVar6);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          __ptr = *(void **)((long)&local_158.data + lVar6);
          plVar3 = *(long **)((long)&local_158.allocator + lVar6);
          if (plVar3 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_158.cstep + lVar6) = 0;
      *(undefined8 *)((long)&local_158.refcount + lVar6 + 4) = 0;
      *(undefined8 *)((long)&local_158.elemsize + lVar6 + 4) = 0;
      *(undefined8 *)((long)&local_158.data + lVar6) = 0;
      *(undefined8 *)((long)&local_158.refcount + lVar6) = 0;
      *(undefined8 *)((long)&local_158.dims + lVar6) = 0;
      *(undefined8 *)((long)&local_158.h + lVar6) = 0;
      *(undefined4 *)((long)&local_158.c + lVar6) = 0;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != -0x48);
    ParamDict::~ParamDict(&pd);
    iVar4 = 0;
  }
  else {
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    make_padding(this,bottom_blob,&local_158,this->kernel_w,this->kernel_h,opt);
    iVar4 = -100;
    if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
      Mat::create(top_blob,(~((this->kernel_w + -1) * this->dilation_w) + local_158.w) /
                           this->stride_w + 1,
                  (~((this->kernel_h + -1) * this->dilation_h) + local_158.h) / this->stride_h + 1,
                  this->num_output,CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize)
                  ,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar4 = 0;
        convolution(&local_158,top_blob,&this->weight_data,&this->bias_data,this->kernel_w,
                    this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
                    this->activation_type,&this->activation_params,(Option *)pd._vptr_ParamDict);
      }
    }
    piVar1 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w * bottom_blob.elempack == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);
            pd.set(9, activation_type);
            pd.set(10, activation_params);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

#if NCNN_INT8
            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = bottom_blob_int8_scales;
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            op->forward(bottom_blob, top_blob, opt);

            op->destroy_pipeline(opt);

            delete op;

            return 0;
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}